

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktShaderBuiltinPrecisionTests.cpp
# Opt level: O2

void __thiscall
vkt::shaderexecutor::Environment::bind<tcu::Vector<float,3>>
          (Environment *this,Variable<tcu::Vector<float,_3>_> *variable,IVal *value)

{
  void *__dest;
  mapped_type mStack_58;
  key_type local_48;
  
  __dest = operator_new__(0x48);
  memcpy(__dest,value,0x48);
  std::__cxx11::string::string((string *)&local_48,(string *)&variable->m_name);
  de::SharedPtr<unsigned_char>::SharedPtr<de::ArrayDeleter<unsigned_char>>(&mStack_58,__dest);
  de::
  insert<std::map<std::__cxx11::string,de::SharedPtr<unsigned_char>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,de::SharedPtr<unsigned_char>>>>>
            (&this->m_map,&local_48,&mStack_58);
  de::SharedPtr<unsigned_char>::release(&mStack_58);
  std::__cxx11::string::~string((string *)&local_48);
  return;
}

Assistant:

void						bind	(const Variable<T>&					variable,
										 const typename Traits<T>::IVal&	value)
	{
		deUint8* const data = new deUint8[sizeof(value)];

		deMemcpy(data, &value, sizeof(value));
		de::insert(m_map, variable.getName(), SharedPtr<deUint8>(data, de::ArrayDeleter<deUint8>()));
	}